

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::ReturnStmt::~ReturnStmt(ReturnStmt *this)

{
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ReturnStmt_001f31e8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->expr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Statement).super_ASTNode.
              super_enable_shared_from_this<mocker::ast::ASTNode>._M_weak_this.
              super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

explicit ReturnStmt(std::shared_ptr<Expression> expr)
      : expr(std::move(expr)) {}